

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitArrayNewFixed
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          ArrayNewFixed *curr)

{
  ExpressionList *pEVar1;
  Type *this_00;
  Expression **ppEVar2;
  Literal *pLVar3;
  HeapType type;
  ExpressionList *__range3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  HeapType heapType;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e8;
  Literal local_d0;
  Literal local_b8;
  undefined1 local_a0 [8];
  Literals data;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  size_t local_58;
  size_t local_50;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_48;
  Type *local_40;
  Flow *local_38;
  
  uVar5 = (curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (0x2aaaaa9 < (uint)uVar5) {
    (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
  }
  pEVar1 = &curr->values;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id == 1) {
    data.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    sVar4 = (curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    local_a0 = (undefined1  [8])pEVar1;
    while( true ) {
      if ((data.super_SmallVector<wasm::Literal,_1UL>.usedFixed == sVar4) &&
         (local_a0 == (undefined1  [8])pEVar1)) {
        handle_unreachable("unreachable but no unreachable child",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0x676);
      }
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_a0);
      visit(__return_storage_ptr__,this,*ppEVar2);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) break;
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      data.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           data.super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
    }
  }
  else {
    uVar5 = uVar5 & 0xffffffff;
    local_40 = &(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type;
    local_48 = &pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    wasm::Type::getHeapType(local_40);
    HeapType::getArray(&heapType);
    local_50 = uVar5;
    SmallVector<wasm::Literal,_1UL>::SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0,uVar5);
    lVar6 = -0x18;
    local_38 = __return_storage_ptr__;
    for (sVar4 = 0; this_00 = local_40, local_50 != sVar4; sVar4 = sVar4 + 1) {
      local_58 = sVar4;
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (local_48,sVar4);
      visit(__return_storage_ptr__,this,*ppEVar2);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_007a753a;
      pLVar3 = Flow::getSingleValue(__return_storage_ptr__);
      Literal::Literal(&local_d0,pLVar3);
      truncateForPacking((Literal *)&local_e8.func,this,&local_d0,(Field *)&heapType);
      sVar4 = local_58;
      pLVar3 = (Literal *)
               (data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar6);
      if (local_58 == 0) {
        pLVar3 = (Literal *)&data;
      }
      Literal::operator=(pLVar3,(Literal *)&local_e8.func);
      Literal::~Literal((Literal *)&local_e8.func);
      Literal::~Literal(&local_d0);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      lVar6 = lVar6 + 0x18;
    }
    local_e8.i64 = (int64_t)wasm::Type::getHeapType(local_40);
    std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals&>
              ((HeapType *)
               &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Literals *)&local_e8.func);
    type = wasm::Type::getHeapType(this_00);
    Literal::Literal(&local_b8,
                     (shared_ptr<wasm::GCData> *)
                     &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,type);
    Flow::Flow(__return_storage_ptr__,&local_b8);
    Literal::~Literal(&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
LAB_007a753a:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewFixed(ArrayNewFixed* curr) {
    NOTE_ENTER("ArrayNewFixed");
    Index num = curr->values.size();
    if (num >= ArrayLimit) {
      hostLimit("allocation failure");
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* value : curr->values) {
        auto result = self()->visit(value);
        if (result.breaking()) {
          return result;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    auto field = heapType.getArray().element;
    Literals data(num);
    for (Index i = 0; i < num; i++) {
      auto value = self()->visit(curr->values[i]);
      if (value.breaking()) {
        return value;
      }
      data[i] = truncateForPacking(value.getSingleValue(), field);
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }